

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_inr
          (CImg<unsigned_char> *this,FILE *file,char *filename,float *voxel_size)

{
  float fVar1;
  double dVar2;
  uchar uVar3;
  unsigned_short uVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  uint uVar19;
  CImgArgumentException *this_00;
  char *pcVar20;
  char *pcVar21;
  uchar *puVar22;
  uchar *puVar23;
  ulong uVar24;
  unsigned_short *ptr;
  short *ptr_00;
  uint *ptr_01;
  int *ptr_02;
  float *pfVar25;
  double *pdVar26;
  CImgIOException *this_01;
  char *local_2c8;
  FILE *local_1f0;
  uint local_1b0;
  uint local_1ac;
  int c_9;
  int x_9;
  int y_9;
  int z_9;
  double *val_9;
  double *xval_9;
  int c_8;
  int x_8;
  int y_8;
  int z_8;
  double *val_8;
  double *xval_8;
  int c_7;
  int x_7;
  int y_7;
  int z_7;
  float *val_7;
  float *xval_7;
  int c_6;
  int x_6;
  int y_6;
  int z_6;
  float *val_6;
  float *xval_6;
  int c_5;
  int x_5;
  int y_5;
  int z_5;
  int *val_5;
  int *xval_5;
  int c_4;
  int x_4;
  int y_4;
  int z_4;
  uint *val_4;
  uint *xval_4;
  int c_3;
  int x_3;
  int y_3;
  int z_3;
  short *val_3;
  short *xval_3;
  int c_2;
  int x_2;
  int y_2;
  int z_2;
  unsigned_short *val_2;
  unsigned_short *xval_2;
  int c_1;
  int x_1;
  int y_1;
  int z_1;
  char *val_1;
  char *xval_1;
  int c;
  int x;
  int y;
  int z;
  uchar *val;
  uchar *xval;
  uint uStack_68;
  bool loaded;
  int endian;
  int fopt [8];
  FILE *nfile;
  float *voxel_size_local;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar19 = this->_width;
    uVar6 = this->_height;
    uVar7 = this->_depth;
    uVar8 = this->_spectrum;
    puVar22 = this->_data;
    pcVar20 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar20 = "";
    }
    pcVar21 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Specified filename is (null)."
               ,(ulong)uVar19,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,puVar22,pcVar20,pcVar21);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_1f0 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_1f0 = cimg::fopen(filename,"rb");
  }
  fopt._24_8_ = local_1f0;
  bVar18 = cimg::endianness();
  uVar19 = (uint)bVar18;
  bVar18 = false;
  if (voxel_size != (float *)0x0) {
    voxel_size[2] = 1.0;
    voxel_size[1] = 1.0;
    *voxel_size = 1.0;
  }
  _load_inr_header((FILE *)fopt._24_8_,(int *)&stack0xffffffffffffff98,voxel_size);
  assign(this,uStack_68,endian,fopt[0],fopt[1]);
  if (((fopt[4] == 8) && (fopt[2] == 0)) && (fopt[3] == 0)) {
    puVar22 = (uchar *)operator_new__((long)(int)uStack_68 * (long)fopt[1]);
    for (x = 0; x < (int)this->_depth; x = x + 1) {
      for (c = 0; c < (int)this->_height; c = c + 1) {
        cimg::fread<unsigned_char>(puVar22,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<unsigned_char>(puVar22,(long)(int)(uStack_68 * fopt[1]));
        }
        val = puVar22;
        for (xval_1._4_4_ = 0; (int)xval_1._4_4_ < (int)this->_width;
            xval_1._4_4_ = xval_1._4_4_ + 1) {
          for (xval_1._0_4_ = 0; (int)(uint)xval_1 < (int)this->_spectrum;
              xval_1._0_4_ = (uint)xval_1 + 1) {
            uVar3 = *val;
            puVar23 = operator()(this,xval_1._4_4_,c,x,(uint)xval_1);
            *puVar23 = uVar3;
            val = val + 1;
          }
        }
      }
    }
    if (puVar22 != (uchar *)0x0) {
      operator_delete__(puVar22);
    }
    bVar18 = true;
  }
  if (((!bVar18) && (fopt[4] == 8)) && ((fopt[2] == 0 && (fopt[3] == 1)))) {
    pcVar20 = (char *)operator_new__((long)(int)uStack_68 * (long)fopt[1]);
    for (x_1 = 0; x_1 < (int)this->_depth; x_1 = x_1 + 1) {
      for (c_1 = 0; c_1 < (int)this->_height; c_1 = c_1 + 1) {
        cimg::fread<char>(pcVar20,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<char>(pcVar20,(long)(int)(uStack_68 * fopt[1]));
        }
        val_1 = pcVar20;
        for (xval_2._4_4_ = 0; (int)xval_2._4_4_ < (int)this->_width;
            xval_2._4_4_ = xval_2._4_4_ + 1) {
          for (xval_2._0_4_ = 0; (int)(uint)xval_2 < (int)this->_spectrum;
              xval_2._0_4_ = (uint)xval_2 + 1) {
            uVar3 = *val_1;
            puVar22 = operator()(this,xval_2._4_4_,c_1,x_1,(uint)xval_2);
            *puVar22 = uVar3;
            val_1 = val_1 + 1;
          }
        }
      }
    }
    if (pcVar20 != (char *)0x0) {
      operator_delete__(pcVar20);
    }
    bVar18 = true;
  }
  if (((!bVar18) && (fopt[4] == 0x10)) && ((fopt[2] == 0 && (fopt[3] == 0)))) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar10 * ZEXT816(2),0);
    if (SUB168(auVar10 * ZEXT816(2),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    ptr = (unsigned_short *)operator_new__(uVar24);
    for (x_2 = 0; x_2 < (int)this->_depth; x_2 = x_2 + 1) {
      for (c_2 = 0; c_2 < (int)this->_height; c_2 = c_2 + 1) {
        cimg::fread<unsigned_short>(ptr,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<unsigned_short>(ptr,(long)(int)(uStack_68 * fopt[1]));
        }
        val_2 = ptr;
        for (xval_3._4_4_ = 0; (int)xval_3._4_4_ < (int)this->_width;
            xval_3._4_4_ = xval_3._4_4_ + 1) {
          for (xval_3._0_4_ = 0; (int)(uint)xval_3 < (int)this->_spectrum;
              xval_3._0_4_ = (uint)xval_3 + 1) {
            uVar4 = *val_2;
            puVar22 = operator()(this,xval_3._4_4_,c_2,x_2,(uint)xval_3);
            *puVar22 = (uchar)uVar4;
            val_2 = val_2 + 1;
          }
        }
      }
    }
    if (ptr != (unsigned_short *)0x0) {
      operator_delete__(ptr);
    }
    bVar18 = true;
  }
  if ((((!bVar18) && (fopt[4] == 0x10)) && (fopt[2] == 0)) && (fopt[3] == 1)) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar11 * ZEXT816(2),0);
    if (SUB168(auVar11 * ZEXT816(2),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    ptr_00 = (short *)operator_new__(uVar24);
    for (x_3 = 0; x_3 < (int)this->_depth; x_3 = x_3 + 1) {
      for (c_3 = 0; c_3 < (int)this->_height; c_3 = c_3 + 1) {
        cimg::fread<short>(ptr_00,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<short>(ptr_00,(long)(int)(uStack_68 * fopt[1]));
        }
        val_3 = ptr_00;
        for (xval_4._4_4_ = 0; (int)xval_4._4_4_ < (int)this->_width;
            xval_4._4_4_ = xval_4._4_4_ + 1) {
          for (xval_4._0_4_ = 0; (int)(uint)xval_4 < (int)this->_spectrum;
              xval_4._0_4_ = (uint)xval_4 + 1) {
            sVar5 = *val_3;
            puVar22 = operator()(this,xval_4._4_4_,c_3,x_3,(uint)xval_4);
            *puVar22 = (uchar)sVar5;
            val_3 = val_3 + 1;
          }
        }
      }
    }
    if (ptr_00 != (short *)0x0) {
      operator_delete__(ptr_00);
    }
    bVar18 = true;
  }
  if (((!bVar18) && (fopt[4] == 0x20)) && ((fopt[2] == 0 && (fopt[3] == 0)))) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar12 * ZEXT816(4),0);
    if (SUB168(auVar12 * ZEXT816(4),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    ptr_01 = (uint *)operator_new__(uVar24);
    for (x_4 = 0; x_4 < (int)this->_depth; x_4 = x_4 + 1) {
      for (c_4 = 0; c_4 < (int)this->_height; c_4 = c_4 + 1) {
        cimg::fread<unsigned_int>(ptr_01,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<unsigned_int>(ptr_01,(long)(int)(uStack_68 * fopt[1]));
        }
        val_4 = ptr_01;
        for (xval_5._4_4_ = 0; (int)xval_5._4_4_ < (int)this->_width;
            xval_5._4_4_ = xval_5._4_4_ + 1) {
          for (xval_5._0_4_ = 0; (int)(uint)xval_5 < (int)this->_spectrum;
              xval_5._0_4_ = (uint)xval_5 + 1) {
            uVar6 = *val_4;
            puVar22 = operator()(this,xval_5._4_4_,c_4,x_4,(uint)xval_5);
            *puVar22 = (uchar)uVar6;
            val_4 = val_4 + 1;
          }
        }
      }
    }
    if (ptr_01 != (uint *)0x0) {
      operator_delete__(ptr_01);
    }
    bVar18 = true;
  }
  if (((!bVar18) && (fopt[4] == 0x20)) && ((fopt[2] == 0 && (fopt[3] == 1)))) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar13 * ZEXT816(4),0);
    if (SUB168(auVar13 * ZEXT816(4),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    ptr_02 = (int *)operator_new__(uVar24);
    for (x_5 = 0; x_5 < (int)this->_depth; x_5 = x_5 + 1) {
      for (c_5 = 0; c_5 < (int)this->_height; c_5 = c_5 + 1) {
        cimg::fread<int>(ptr_02,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<int>(ptr_02,(long)(int)(uStack_68 * fopt[1]));
        }
        val_5 = ptr_02;
        for (xval_6._4_4_ = 0; (int)xval_6._4_4_ < (int)this->_width;
            xval_6._4_4_ = xval_6._4_4_ + 1) {
          for (xval_6._0_4_ = 0; (int)(uint)xval_6 < (int)this->_spectrum;
              xval_6._0_4_ = (uint)xval_6 + 1) {
            iVar9 = *val_5;
            puVar22 = operator()(this,xval_6._4_4_,c_5,x_5,(uint)xval_6);
            *puVar22 = (uchar)iVar9;
            val_5 = val_5 + 1;
          }
        }
      }
    }
    if (ptr_02 != (int *)0x0) {
      operator_delete__(ptr_02);
    }
    bVar18 = true;
  }
  if ((((!bVar18) && (fopt[4] == 0x20)) && (fopt[2] == 1)) && (fopt[3] == 0)) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar14 * ZEXT816(4),0);
    if (SUB168(auVar14 * ZEXT816(4),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    pfVar25 = (float *)operator_new__(uVar24);
    for (x_6 = 0; x_6 < (int)this->_depth; x_6 = x_6 + 1) {
      for (c_6 = 0; c_6 < (int)this->_height; c_6 = c_6 + 1) {
        cimg::fread<float>(pfVar25,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<float>(pfVar25,(long)(int)(uStack_68 * fopt[1]));
        }
        val_6 = pfVar25;
        for (xval_7._4_4_ = 0; (int)xval_7._4_4_ < (int)this->_width;
            xval_7._4_4_ = xval_7._4_4_ + 1) {
          for (xval_7._0_4_ = 0; (int)(uint)xval_7 < (int)this->_spectrum;
              xval_7._0_4_ = (uint)xval_7 + 1) {
            fVar1 = *val_6;
            puVar22 = operator()(this,xval_7._4_4_,c_6,x_6,(uint)xval_7);
            *puVar22 = (uchar)(int)fVar1;
            val_6 = val_6 + 1;
          }
        }
      }
    }
    if (pfVar25 != (float *)0x0) {
      operator_delete__(pfVar25);
    }
    bVar18 = true;
  }
  if (((!bVar18) && (fopt[4] == 0x20)) && ((fopt[2] == 1 && (fopt[3] == 1)))) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar15 * ZEXT816(4),0);
    if (SUB168(auVar15 * ZEXT816(4),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    pfVar25 = (float *)operator_new__(uVar24);
    for (x_7 = 0; x_7 < (int)this->_depth; x_7 = x_7 + 1) {
      for (c_7 = 0; c_7 < (int)this->_height; c_7 = c_7 + 1) {
        cimg::fread<float>(pfVar25,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<float>(pfVar25,(long)(int)(uStack_68 * fopt[1]));
        }
        val_7 = pfVar25;
        for (xval_8._4_4_ = 0; (int)xval_8._4_4_ < (int)this->_width;
            xval_8._4_4_ = xval_8._4_4_ + 1) {
          for (xval_8._0_4_ = 0; (int)(uint)xval_8 < (int)this->_spectrum;
              xval_8._0_4_ = (uint)xval_8 + 1) {
            fVar1 = *val_7;
            puVar22 = operator()(this,xval_8._4_4_,c_7,x_7,(uint)xval_8);
            *puVar22 = (uchar)(int)fVar1;
            val_7 = val_7 + 1;
          }
        }
      }
    }
    if (pfVar25 != (float *)0x0) {
      operator_delete__(pfVar25);
    }
    bVar18 = true;
  }
  if (((!bVar18) && (fopt[4] == 0x40)) && ((fopt[2] == 1 && (fopt[3] == 0)))) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar16 * ZEXT816(8),0);
    if (SUB168(auVar16 * ZEXT816(8),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    pdVar26 = (double *)operator_new__(uVar24);
    for (x_8 = 0; x_8 < (int)this->_depth; x_8 = x_8 + 1) {
      for (c_8 = 0; c_8 < (int)this->_height; c_8 = c_8 + 1) {
        cimg::fread<double>(pdVar26,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<double>(pdVar26,(long)(int)(uStack_68 * fopt[1]));
        }
        val_8 = pdVar26;
        for (xval_9._4_4_ = 0; (int)xval_9._4_4_ < (int)this->_width;
            xval_9._4_4_ = xval_9._4_4_ + 1) {
          for (xval_9._0_4_ = 0; (int)(uint)xval_9 < (int)this->_spectrum;
              xval_9._0_4_ = (uint)xval_9 + 1) {
            dVar2 = *val_8;
            puVar22 = operator()(this,xval_9._4_4_,c_8,x_8,(uint)xval_9);
            *puVar22 = (uchar)(int)dVar2;
            val_8 = val_8 + 1;
          }
        }
      }
    }
    if (pdVar26 != (double *)0x0) {
      operator_delete__(pdVar26);
    }
    bVar18 = true;
  }
  if ((((!bVar18) && (fopt[4] == 0x40)) && (fopt[2] == 1)) && (fopt[3] == 1)) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (long)(int)uStack_68 * (long)fopt[1];
    uVar24 = SUB168(auVar17 * ZEXT816(8),0);
    if (SUB168(auVar17 * ZEXT816(8),8) != 0) {
      uVar24 = 0xffffffffffffffff;
    }
    pdVar26 = (double *)operator_new__(uVar24);
    for (x_9 = 0; x_9 < (int)this->_depth; x_9 = x_9 + 1) {
      for (c_9 = 0; c_9 < (int)this->_height; c_9 = c_9 + 1) {
        cimg::fread<double>(pdVar26,(long)(int)(uStack_68 * fopt[1]),(FILE *)fopt._24_8_);
        if (fopt[5] != uVar19) {
          cimg::invert_endianness<double>(pdVar26,(long)(int)(uStack_68 * fopt[1]));
        }
        val_9 = pdVar26;
        for (local_1ac = 0; (int)local_1ac < (int)this->_width; local_1ac = local_1ac + 1) {
          for (local_1b0 = 0; (int)local_1b0 < (int)this->_spectrum; local_1b0 = local_1b0 + 1) {
            dVar2 = *val_9;
            puVar22 = operator()(this,local_1ac,c_9,x_9,local_1b0);
            *puVar22 = (uchar)(int)dVar2;
            val_9 = val_9 + 1;
          }
        }
      }
    }
    if (pdVar26 != (double *)0x0) {
      operator_delete__(pdVar26);
    }
    bVar18 = true;
  }
  if (bVar18) {
    if (file == (FILE *)0x0) {
      cimg::fclose((FILE *)fopt._24_8_);
    }
    return this;
  }
  if (file == (FILE *)0x0) {
    cimg::fclose((FILE *)fopt._24_8_);
  }
  this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
  uVar19 = this->_width;
  uVar6 = this->_height;
  uVar7 = this->_depth;
  uVar8 = this->_spectrum;
  puVar22 = this->_data;
  pcVar20 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar20 = "";
  }
  pcVar21 = pixel_type();
  local_2c8 = filename;
  if (filename == (char *)0x0) {
    local_2c8 = "(FILE*)";
  }
  CImgIOException::CImgIOException
            (this_01,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Unknown pixel type defined in file \'%s\'."
             ,(ulong)uVar19,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,puVar22,pcVar20,pcVar21,local_2c8
            );
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImg<T>& _load_inr(std::FILE *const file, const char *const filename, float *const voxel_size) {
#define _cimg_load_inr_case(Tf,sign,pixsize,Ts) \
     if (!loaded && fopt[6]==pixsize && fopt[4]==Tf && fopt[5]==sign) { \
        Ts *xval, *const val = new Ts[(size_t)fopt[0]*fopt[3]]; \
        cimg_forYZ(*this,y,z) { \
            cimg::fread(val,fopt[0]*fopt[3],nfile); \
            if (fopt[7]!=endian) cimg::invert_endianness(val,fopt[0]*fopt[3]); \
            xval = val; cimg_forX(*this,x) cimg_forC(*this,c) (*this)(x,y,z,c) = (T)*(xval++); \
          } \
        delete[] val; \
        loaded = true; \
      }

      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_inr(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      int fopt[8], endian = cimg::endianness()?1:0;
      bool loaded = false;
      if (voxel_size) voxel_size[0] = voxel_size[1] = voxel_size[2] = 1;
      _load_inr_header(nfile,fopt,voxel_size);
      assign(fopt[0],fopt[1],fopt[2],fopt[3]);
      _cimg_load_inr_case(0,0,8,unsigned char);
      _cimg_load_inr_case(0,1,8,char);
      _cimg_load_inr_case(0,0,16,unsigned short);
      _cimg_load_inr_case(0,1,16,short);
      _cimg_load_inr_case(0,0,32,unsigned int);
      _cimg_load_inr_case(0,1,32,int);
      _cimg_load_inr_case(1,0,32,float);
      _cimg_load_inr_case(1,1,32,float);
      _cimg_load_inr_case(1,0,64,double);
      _cimg_load_inr_case(1,1,64,double);
      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_inr(): Unknown pixel type defined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }